

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datalogProgram.cpp
# Opt level: O2

string * __thiscall
DatalogProgram::toString_abi_cxx11_(string *__return_storage_ptr__,DatalogProgram *this)

{
  _Base_ptr p_Var1;
  char *pcVar2;
  uint uVar3;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  allocator local_31;
  
  std::__cxx11::string::string((string *)&local_f8,"Schemes",(allocator *)&local_58);
  pred_list_str(__return_storage_ptr__,this,&local_f8,&this->schemes);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string((string *)&local_d8,"Facts",&local_31);
  pred_list_str(&local_58,this,&local_d8,&this->facts);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_d8);
  pcVar2 = "Rules";
  std::__cxx11::string::string((string *)&local_b8,"Rules",&local_31);
  lheader(&local_58,(DatalogProgram *)pcVar2,&local_b8,
          (int)((ulong)((long)(this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3));
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b8);
  for (uVar3 = 0;
      (ulong)uVar3 <
      (ulong)((long)(this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    Rule::toString_abi_cxx11_
              (&local_58,
               (this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3]);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::string((string *)&local_98,"Queries",&local_31);
  pred_list_str(&local_58,this,&local_98,&this->queries);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  pcVar2 = "Domain";
  std::__cxx11::string::string((string *)&local_78,"Domain",&local_31);
  lheader(&local_58,(DatalogProgram *)pcVar2,&local_78,
          (int)(this->domain)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  for (p_Var1 = (this->domain)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->domain)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string DatalogProgram::toString()
{
  string res = pred_list_str("Schemes", schemes);
  res += pred_list_str("Facts", facts);
  res += lheader((string)"Rules", rules.size());

  for (unsigned int i = 0; i < rules.size(); i++) {
    res += "  ";
    res += rules[i]->toString();
    res += "\n";
  }

  res += pred_list_str("Queries", queries);

  res += lheader("Domain", domain.size());
  set<string>::iterator it;
  for (it = domain.begin(); it != domain.end(); ++it)
  {
    res += "  ";
    res += *it;
    res += "\n";
  }
  return res;
}